

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.cpp
# Opt level: O2

size_t duckdb_zstd::HIST_count_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,void *workSpace
                 ,size_t workSpaceSize)

{
  size_t sVar1;
  undefined8 uStack_8;
  
  if (((ulong)workSpace & 3) == 0) {
    if (0xfff < workSpaceSize) {
      if (*maxSymbolValuePtr < 0xff) {
        sVar1 = HIST_count_parallel_wksp
                          (count,maxSymbolValuePtr,source,sourceSize,checkMaxSymbolValue,
                           (U32 *)workSpace);
        return sVar1;
      }
      *maxSymbolValuePtr = 0xff;
      sVar1 = HIST_countFast_wksp(count,maxSymbolValuePtr,source,sourceSize,workSpace,workSpaceSize)
      ;
      return sVar1;
    }
    uStack_8 = 0xffffffffffffffbe;
  }
  else {
    uStack_8 = 0xffffffffffffffff;
  }
  return uStack_8;
}

Assistant:

size_t HIST_count_wksp(unsigned* count, unsigned* maxSymbolValuePtr,
                       const void* source, size_t sourceSize,
                       void* workSpace, size_t workSpaceSize)
{
    if ((size_t)workSpace & 3) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (workSpaceSize < HIST_WKSP_SIZE) return ERROR(workSpace_tooSmall);
    if (*maxSymbolValuePtr < 255)
        return HIST_count_parallel_wksp(count, maxSymbolValuePtr, source, sourceSize, checkMaxSymbolValue, (U32*)workSpace);
    *maxSymbolValuePtr = 255;
    return HIST_countFast_wksp(count, maxSymbolValuePtr, source, sourceSize, workSpace, workSpaceSize);
}